

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  int iVar31;
  undefined8 uVar32;
  Scene *pSVar33;
  Ref<embree::Geometry> *pRVar34;
  Geometry *pGVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  RTCFilterFunctionN p_Var41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar48;
  int iVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  float fVar79;
  float fVar80;
  float fVar100;
  float fVar102;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar101;
  float fVar103;
  float fVar104;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar99;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar153;
  float fVar157;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar148;
  undefined1 auVar149 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar178;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar186;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar191;
  undefined1 auVar192 [16];
  float fVar193;
  float fVar196;
  float fVar197;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  undefined1 auVar199 [16];
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar201 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  uint uVar224;
  int iVar225;
  float fVar226;
  uint uVar227;
  int iVar228;
  float fVar229;
  uint uVar230;
  int iVar231;
  float fVar232;
  uint uVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 local_1348 [8];
  float fStack_1340;
  float fStack_133c;
  vbool<4> valid;
  float fStack_1310;
  float fStack_130c;
  undefined8 local_12f8;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined8 local_12c8;
  float fStack_12c0;
  float fStack_12bc;
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  RTCFilterFunctionNArguments args;
  float fStack_1260;
  float fStack_125c;
  float fStack_1234;
  float fStack_1224;
  vfloat<4> tNear;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8 [4];
  float local_10d8 [4];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [8];
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar56;
  Scene *pSVar60;
  
  pSVar52 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar79 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar141 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar165 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar144 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar178 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar49 = (tray->tnear).field_0.i[k];
  iVar225 = (tray->tfar).field_0.i[k];
  auVar174._4_4_ = iVar225;
  auVar174._0_4_ = iVar225;
  auVar174._8_4_ = iVar225;
  auVar174._12_4_ = iVar225;
  local_1008 = mm_lookupmask_ps._0_8_;
  uStack_1000 = mm_lookupmask_ps._8_8_;
  local_1018 = mm_lookupmask_ps._240_8_;
  uStack_1010 = mm_lookupmask_ps._248_8_;
  uVar58 = 1 << ((byte)k & 0x1f);
  pSVar60 = (Scene *)(ulong)uVar58;
  local_f98 = fVar79;
  fStack_f94 = fVar79;
  fStack_f90 = fVar79;
  fStack_f8c = fVar79;
  local_fa8 = fVar141;
  fStack_fa4 = fVar141;
  fStack_fa0 = fVar141;
  fStack_f9c = fVar141;
  local_fb8 = fVar165;
  fStack_fb4 = fVar165;
  fStack_fb0 = fVar165;
  fStack_fac = fVar165;
  local_fc8 = fVar80;
  fStack_fc4 = fVar80;
  fStack_fc0 = fVar80;
  fStack_fbc = fVar80;
  local_fd8 = fVar144;
  fStack_fd4 = fVar144;
  fStack_fd0 = fVar144;
  fStack_fcc = fVar144;
  local_fe8 = fVar178;
  fStack_fe4 = fVar178;
  fStack_fe0 = fVar178;
  fStack_fdc = fVar178;
  local_ff8 = iVar49;
  iStack_ff4 = iVar49;
  iStack_ff0 = iVar49;
  iStack_fec = iVar49;
  fVar121 = fVar165;
  fVar120 = fVar165;
  fVar111 = fVar165;
  fVar110 = fVar79;
  fVar109 = fVar79;
  fVar108 = fVar79;
  iVar231 = iVar49;
  iVar228 = iVar49;
  iVar225 = iVar49;
  fVar107 = fVar178;
  fVar106 = fVar178;
  fVar105 = fVar178;
  fVar163 = fVar144;
  fVar104 = fVar144;
  fVar159 = fVar144;
  fVar103 = fVar80;
  fVar102 = fVar80;
  fVar184 = fVar80;
  fVar155 = fVar141;
  fVar101 = fVar141;
  fVar100 = fVar141;
LAB_0027ea56:
  do {
    pSVar48 = pSVar52 + -1;
    pSVar52 = pSVar52 + -1;
    if ((float)pSVar48->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar48->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar77 = (pSVar52->ptr).ptr;
      while ((uVar77 & 8) == 0) {
        uVar57 = uVar77 & 0xfffffffffffffff0;
        fVar122 = *(float *)(ray + k * 4 + 0x70);
        pfVar30 = (float *)(uVar57 + 0x80 + uVar67);
        pfVar29 = (float *)(uVar57 + 0x20 + uVar67);
        auVar166._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar108) * fVar184;
        auVar166._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar109) * fVar102;
        auVar166._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar110) * fVar103;
        auVar166._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar79) * fVar80;
        auVar146._4_4_ = iVar228;
        auVar146._0_4_ = iVar225;
        auVar146._8_4_ = iVar231;
        auVar146._12_4_ = iVar49;
        auVar146 = maxps(auVar146,auVar166);
        pfVar30 = (float *)(uVar57 + 0x80 + uVar72);
        pfVar29 = (float *)(uVar57 + 0x20 + uVar72);
        auVar189._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar100) * fVar159;
        auVar189._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar101) * fVar104;
        auVar189._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar155) * fVar163;
        auVar189._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar141) * fVar144;
        pfVar30 = (float *)(uVar57 + 0x80 + uVar78);
        pfVar29 = (float *)(uVar57 + 0x20 + uVar78);
        auVar195._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar111) * fVar105;
        auVar195._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar120) * fVar106;
        auVar195._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar121) * fVar107;
        auVar195._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar165) * fVar178;
        auVar166 = maxps(auVar189,auVar195);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar146,auVar166);
        pfVar30 = (float *)(uVar57 + 0x80 + (uVar67 ^ 0x10));
        pfVar29 = (float *)(uVar57 + 0x20 + (uVar67 ^ 0x10));
        auVar179._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar108) * fVar184;
        auVar179._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar109) * fVar102;
        auVar179._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar110) * fVar103;
        auVar179._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar79) * fVar80;
        pfVar30 = (float *)(uVar57 + 0x80 + (uVar72 ^ 0x10));
        pfVar29 = (float *)(uVar57 + 0x20 + (uVar72 ^ 0x10));
        auVar187._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar100) * fVar159;
        auVar187._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar101) * fVar104;
        auVar187._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar155) * fVar163;
        auVar187._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar141) * fVar144;
        pfVar30 = (float *)(uVar57 + 0x80 + (uVar78 ^ 0x10));
        pfVar29 = (float *)(uVar57 + 0x20 + (uVar78 ^ 0x10));
        auVar190._0_4_ = ((*pfVar30 * fVar122 + *pfVar29) - fVar111) * fVar105;
        auVar190._4_4_ = ((pfVar30[1] * fVar122 + pfVar29[1]) - fVar120) * fVar106;
        auVar190._8_4_ = ((pfVar30[2] * fVar122 + pfVar29[2]) - fVar121) * fVar107;
        auVar190._12_4_ = ((pfVar30[3] * fVar122 + pfVar29[3]) - fVar165) * fVar178;
        auVar166 = minps(auVar187,auVar190);
        auVar146 = minps(auVar174,auVar179);
        auVar146 = minps(auVar146,auVar166);
        if (((uint)uVar77 & 7) == 6) {
          bVar42 = (fVar122 < *(float *)(uVar57 + 0xf0) && *(float *)(uVar57 + 0xe0) <= fVar122) &&
                   tNear.field_0._0_4_ <= auVar146._0_4_;
          bVar43 = (fVar122 < *(float *)(uVar57 + 0xf4) && *(float *)(uVar57 + 0xe4) <= fVar122) &&
                   tNear.field_0._4_4_ <= auVar146._4_4_;
          bVar44 = (fVar122 < *(float *)(uVar57 + 0xf8) && *(float *)(uVar57 + 0xe8) <= fVar122) &&
                   tNear.field_0._8_4_ <= auVar146._8_4_;
          bVar45 = (fVar122 < *(float *)(uVar57 + 0xfc) && *(float *)(uVar57 + 0xec) <= fVar122) &&
                   tNear.field_0._12_4_ <= auVar146._12_4_;
        }
        else {
          bVar42 = tNear.field_0._0_4_ <= auVar146._0_4_;
          bVar43 = tNear.field_0._4_4_ <= auVar146._4_4_;
          bVar44 = tNear.field_0._8_4_ <= auVar146._8_4_;
          bVar45 = tNear.field_0._12_4_ <= auVar146._12_4_;
        }
        auVar81._0_4_ = (uint)bVar42 * -0x80000000;
        auVar81._4_4_ = (uint)bVar43 * -0x80000000;
        auVar81._8_4_ = (uint)bVar44 * -0x80000000;
        auVar81._12_4_ = (uint)bVar45 * -0x80000000;
        uVar59 = movmskps((int)pSVar60,auVar81);
        pSVar60 = (Scene *)(ulong)uVar59;
        if (uVar59 == 0) {
          if (pSVar52 == stack) {
            return;
          }
          goto LAB_0027ea56;
        }
        pSVar60 = (Scene *)0x0;
        if ((byte)uVar59 != 0) {
          for (; ((byte)uVar59 >> (long)pSVar60 & 1) == 0;
              pSVar60 = (Scene *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                         super_RefCount._vptr_RefCount + 1)) {
          }
        }
        uVar77 = *(ulong *)(uVar57 + (long)pSVar60 * 8);
        uVar59 = (uVar59 & 0xff) - 1 & uVar59 & 0xff;
        if (uVar59 != 0) {
          uVar224 = tNear.field_0.i[(long)pSVar60];
          lVar54 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          uVar55 = *(ulong *)(uVar57 + lVar54 * 8);
          uVar227 = tNear.field_0.i[lVar54];
          uVar59 = uVar59 - 1 & uVar59;
          pSVar60 = (Scene *)(ulong)uVar59;
          if (uVar59 == 0) {
            if (uVar224 < uVar227) {
              (pSVar52->ptr).ptr = uVar55;
              pSVar52->dist = uVar227;
              pSVar52 = pSVar52 + 1;
            }
            else {
              (pSVar52->ptr).ptr = uVar77;
              pSVar52->dist = uVar224;
              pSVar52 = pSVar52 + 1;
              uVar77 = uVar55;
            }
          }
          else {
            auVar147._8_4_ = uVar224;
            auVar147._0_8_ = uVar77;
            auVar147._12_4_ = 0;
            auVar180._8_4_ = uVar227;
            auVar180._0_8_ = uVar55;
            auVar180._12_4_ = 0;
            lVar54 = 0;
            if (pSVar60 != (Scene *)0x0) {
              for (; (uVar59 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            uVar32 = *(undefined8 *)(uVar57 + lVar54 * 8);
            iVar31 = tNear.field_0.i[lVar54];
            auVar167._8_4_ = iVar31;
            auVar167._0_8_ = uVar32;
            auVar167._12_4_ = 0;
            auVar82._8_4_ = -(uint)((int)uVar224 < (int)uVar227);
            uVar59 = uVar59 - 1 & uVar59;
            if (uVar59 == 0) {
              auVar82._4_4_ = auVar82._8_4_;
              auVar82._0_4_ = auVar82._8_4_;
              auVar82._12_4_ = auVar82._8_4_;
              auVar188._8_4_ = uVar227;
              auVar188._0_8_ = uVar55;
              auVar188._12_4_ = 0;
              auVar189 = blendvps(auVar188,auVar147,auVar82);
              auVar146 = blendvps(auVar147,auVar180,auVar82);
              auVar83._8_4_ = -(uint)(auVar189._8_4_ < iVar31);
              auVar83._4_4_ = auVar83._8_4_;
              auVar83._0_4_ = auVar83._8_4_;
              auVar83._12_4_ = auVar83._8_4_;
              auVar181._8_4_ = iVar31;
              auVar181._0_8_ = uVar32;
              auVar181._12_4_ = 0;
              auVar166 = blendvps(auVar181,auVar189,auVar83);
              auVar189 = blendvps(auVar189,auVar167,auVar83);
              auVar84._8_4_ = -(uint)(auVar146._8_4_ < auVar189._8_4_);
              auVar84._4_4_ = auVar84._8_4_;
              auVar84._0_4_ = auVar84._8_4_;
              auVar84._12_4_ = auVar84._8_4_;
              SVar168 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar189,auVar146,auVar84);
              SVar148 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar189,auVar84);
              *pSVar52 = SVar148;
              pSVar52[1] = SVar168;
              uVar77 = auVar166._0_8_;
              pSVar52 = pSVar52 + 2;
            }
            else {
              pSVar60 = (Scene *)0x0;
              if (uVar59 != 0) {
                for (; (uVar59 >> (long)pSVar60 & 1) == 0;
                    pSVar60 = (Scene *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                               super_RefCount._vptr_RefCount + 1)) {
                }
              }
              auVar85._4_4_ = auVar82._8_4_;
              auVar85._0_4_ = auVar82._8_4_;
              auVar85._8_4_ = auVar82._8_4_;
              auVar85._12_4_ = auVar82._8_4_;
              auVar190 = blendvps(auVar180,auVar147,auVar85);
              auVar146 = blendvps(auVar147,auVar180,auVar85);
              auVar194._8_4_ = tNear.field_0.i[(long)pSVar60];
              auVar194._0_8_ = *(undefined8 *)(uVar57 + (long)pSVar60 * 8);
              auVar194._12_4_ = 0;
              auVar86._8_4_ = -(uint)(iVar31 < tNear.field_0.i[(long)pSVar60]);
              auVar86._4_4_ = auVar86._8_4_;
              auVar86._0_4_ = auVar86._8_4_;
              auVar86._12_4_ = auVar86._8_4_;
              auVar189 = blendvps(auVar194,auVar167,auVar86);
              auVar166 = blendvps(auVar167,auVar194,auVar86);
              auVar87._8_4_ = -(uint)(auVar146._8_4_ < auVar166._8_4_);
              auVar87._4_4_ = auVar87._8_4_;
              auVar87._0_4_ = auVar87._8_4_;
              auVar87._12_4_ = auVar87._8_4_;
              auVar195 = blendvps(auVar166,auVar146,auVar87);
              SVar148 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar166,auVar87);
              auVar88._8_4_ = -(uint)(auVar190._8_4_ < auVar189._8_4_);
              auVar88._4_4_ = auVar88._8_4_;
              auVar88._0_4_ = auVar88._8_4_;
              auVar88._12_4_ = auVar88._8_4_;
              auVar146 = blendvps(auVar189,auVar190,auVar88);
              auVar166 = blendvps(auVar190,auVar189,auVar88);
              auVar89._8_4_ = -(uint)(auVar166._8_4_ < auVar195._8_4_);
              auVar89._4_4_ = auVar89._8_4_;
              auVar89._0_4_ = auVar89._8_4_;
              auVar89._12_4_ = auVar89._8_4_;
              SVar168 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar195,auVar166,auVar89);
              SVar191 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar166,auVar195,auVar89);
              *pSVar52 = SVar148;
              pSVar52[1] = SVar191;
              pSVar52[2] = SVar168;
              uVar77 = auVar146._0_8_;
              pSVar52 = pSVar52 + 3;
            }
          }
        }
      }
      uVar57 = (ulong)((uint)uVar77 & 0xf);
      if (uVar57 != 8) {
        uVar77 = uVar77 & 0xfffffffffffffff0;
        lVar54 = 0;
        do {
          lVar73 = lVar54 * 0x60;
          pSVar33 = context->scene;
          pRVar34 = (pSVar33->geometries).items;
          pGVar35 = pRVar34[*(uint *)(uVar77 + 0x40 + lVar73)].ptr;
          fVar79 = (pGVar35->time_range).lower;
          fVar141 = (pGVar35->time_range).upper - fVar79;
          fVar165 = ((*(float *)(ray + k * 4 + 0x70) - fVar79) / fVar141) *
                    pGVar35->fnumTimeSegments;
          auVar149 = roundss(ZEXT416((uint)fVar141),ZEXT416((uint)fVar165),9);
          fVar79 = pGVar35->fnumTimeSegments + -1.0;
          if (fVar79 <= auVar149._0_4_) {
            auVar149._0_4_ = fVar79;
          }
          fVar79 = 0.0;
          if (0.0 <= auVar149._0_4_) {
            fVar79 = auVar149._0_4_;
          }
          lVar74 = (long)(int)fVar79 * 0x38;
          lVar36 = *(long *)(*(long *)&pGVar35[2].numPrimitives + lVar74);
          uVar66 = (ulong)*(uint *)(uVar77 + 4 + lVar73);
          pfVar29 = (float *)(lVar36 + (ulong)*(uint *)(uVar77 + lVar73) * 4);
          uVar55 = (ulong)*(uint *)(uVar77 + 0x10 + lVar73);
          pfVar30 = (float *)(lVar36 + uVar55 * 4);
          uVar56 = (ulong)*(uint *)(uVar77 + 0x20 + lVar73);
          pfVar1 = (float *)(lVar36 + uVar56 * 4);
          uVar61 = (ulong)*(uint *)(uVar77 + 0x30 + lVar73);
          pfVar2 = (float *)(lVar36 + uVar61 * 4);
          lVar36 = *(long *)&pRVar34[*(uint *)(uVar77 + 0x44 + lVar73)].ptr[2].numPrimitives;
          lVar37 = *(long *)(lVar36 + lVar74);
          pfVar3 = (float *)(lVar37 + uVar66 * 4);
          uVar62 = (ulong)*(uint *)(uVar77 + 0x14 + lVar73);
          pfVar4 = (float *)(lVar37 + uVar62 * 4);
          uVar63 = (ulong)*(uint *)(uVar77 + 0x24 + lVar73);
          pfVar5 = (float *)(lVar37 + uVar63 * 4);
          uVar64 = (ulong)*(uint *)(uVar77 + 0x34 + lVar73);
          pfVar6 = (float *)(lVar37 + uVar64 * 4);
          lVar37 = *(long *)&pRVar34[*(uint *)(uVar77 + 0x48 + lVar73)].ptr[2].numPrimitives;
          lVar38 = *(long *)(lVar37 + lVar74);
          uVar65 = (ulong)*(uint *)(uVar77 + 8 + lVar73);
          pfVar7 = (float *)(lVar38 + uVar65 * 4);
          uVar69 = (ulong)*(uint *)(uVar77 + 0x18 + lVar73);
          pfVar8 = (float *)(lVar38 + uVar69 * 4);
          uVar70 = (ulong)*(uint *)(uVar77 + 0x28 + lVar73);
          uVar71 = (ulong)*(uint *)(uVar77 + 0x38 + lVar73);
          pfVar9 = (float *)(lVar38 + uVar71 * 4);
          fVar165 = fVar165 - fVar79;
          lVar39 = *(long *)&pRVar34[*(uint *)(uVar77 + 0x4c + lVar73)].ptr[2].numPrimitives;
          lVar74 = *(long *)(lVar39 + lVar74);
          uVar68 = (ulong)*(uint *)(uVar77 + 0xc + lVar73);
          pfVar10 = (float *)(lVar74 + uVar68 * 4);
          uVar75 = (ulong)*(uint *)(uVar77 + 0x1c + lVar73);
          pfVar11 = (float *)(lVar74 + uVar75 * 4);
          uVar76 = (ulong)*(uint *)(uVar77 + 0x2c + lVar73);
          uVar59 = *(uint *)(uVar77 + 0x3c + lVar73);
          pfVar12 = (float *)(lVar74 + (ulong)uVar59 * 4);
          lVar53 = (long)((int)fVar79 + 1) * 0x38;
          lVar40 = *(long *)(*(long *)&pGVar35[2].numPrimitives + lVar53);
          pfVar13 = (float *)(lVar40 + (ulong)*(uint *)(uVar77 + lVar73) * 4);
          lVar37 = *(long *)(lVar37 + lVar53);
          pfVar14 = (float *)(lVar37 + uVar65 * 4);
          local_f88 = CONCAT44(pfVar6[2],pfVar2[2]);
          stack[0].ptr.ptr._4_4_ = pfVar12[2];
          stack[0].ptr.ptr._0_4_ = pfVar9[2];
          pSVar60 = *(Scene **)(lVar36 + lVar53);
          pfVar15 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + uVar66 * 4);
          lVar36 = *(long *)(lVar39 + lVar53);
          pfVar16 = (float *)(lVar36 + uVar68 * 4);
          pfVar17 = (float *)(lVar40 + uVar55 * 4);
          pfVar18 = (float *)(lVar37 + uVar69 * 4);
          pfVar19 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + uVar62 * 4);
          pfVar20 = (float *)(lVar36 + uVar75 * 4);
          pfVar21 = (float *)(lVar40 + uVar56 * 4);
          pfVar22 = (float *)(lVar37 + uVar70 * 4);
          pfVar23 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + uVar63 * 4);
          pfVar24 = (float *)(lVar36 + uVar76 * 4);
          pfVar25 = (float *)(lVar40 + uVar61 * 4);
          pfVar26 = (float *)(lVar37 + uVar71 * 4);
          pfVar27 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + uVar64 * 4);
          pfVar28 = (float *)(lVar36 + (ulong)uVar59 * 4);
          fVar79 = 1.0 - fVar165;
          fVar105 = *pfVar29 * fVar79 + *pfVar13 * fVar165;
          fVar120 = *pfVar3 * fVar79 + *pfVar15 * fVar165;
          fVar127 = *pfVar7 * fVar79 + *pfVar14 * fVar165;
          fVar134 = *pfVar10 * fVar79 + *pfVar16 * fVar165;
          fVar106 = pfVar29[1] * fVar79 + pfVar13[1] * fVar165;
          fVar121 = pfVar3[1] * fVar79 + pfVar15[1] * fVar165;
          fVar128 = pfVar7[1] * fVar79 + pfVar14[1] * fVar165;
          fVar135 = pfVar10[1] * fVar79 + pfVar16[1] * fVar165;
          fVar107 = *pfVar8 * fVar79 + pfVar13[2] * fVar165;
          fVar122 = *pfVar11 * fVar79 + pfVar15[2] * fVar165;
          fVar129 = pfVar7[2] * fVar79 + pfVar14[2] * fVar165;
          fVar136 = pfVar10[2] * fVar79 + pfVar16[2] * fVar165;
          fVar108 = *pfVar30 * fVar79 + *pfVar17 * fVar165;
          fVar123 = *pfVar4 * fVar79 + *pfVar19 * fVar165;
          fVar130 = fStack_12f0 * fVar79 + *pfVar18 * fVar165;
          fVar137 = fStack_12ec * fVar79 + *pfVar20 * fVar165;
          fVar109 = pfVar30[1] * fVar79 + pfVar17[1] * fVar165;
          fVar124 = pfVar4[1] * fVar79 + pfVar19[1] * fVar165;
          fVar131 = pfVar8[1] * fVar79 + pfVar18[1] * fVar165;
          fVar138 = pfVar11[1] * fVar79 + pfVar20[1] * fVar165;
          fVar110 = *pfVar9 * fVar79 + pfVar17[2] * fVar165;
          fVar125 = *pfVar12 * fVar79 + pfVar19[2] * fVar165;
          fVar132 = pfVar8[2] * fVar79 + pfVar18[2] * fVar165;
          fVar139 = pfVar11[2] * fVar79 + pfVar20[2] * fVar165;
          fVar142 = *pfVar1 * fVar79 + *pfVar21 * fVar165;
          fVar153 = *pfVar5 * fVar79 + *pfVar23 * fVar165;
          fVar157 = fStack_1310 * fVar79 + *pfVar22 * fVar165;
          fVar161 = fStack_130c * fVar79 + *pfVar24 * fVar165;
          fVar143 = pfVar1[1] * fVar79 + pfVar21[1] * fVar165;
          fVar154 = pfVar5[1] * fVar79 + pfVar23[1] * fVar165;
          fVar158 = *(float *)(lVar38 + uVar70 * 4 + 4) * fVar79 + pfVar22[1] * fVar165;
          fVar162 = *(float *)(lVar74 + uVar76 * 4 + 4) * fVar79 + pfVar24[1] * fVar165;
          local_1348._0_4_ = pfVar1[2] * fVar79 + pfVar21[2] * fVar165;
          local_1348._4_4_ = pfVar5[2] * fVar79 + pfVar23[2] * fVar165;
          fStack_1340 = fStack_1340 * fVar79 + pfVar22[2] * fVar165;
          fStack_133c = fStack_133c * fVar79 + pfVar24[2] * fVar165;
          fVar144 = *pfVar2 * fVar79 + *pfVar25 * fVar165;
          fVar155 = *pfVar6 * fVar79 + *pfVar27 * fVar165;
          fVar159 = fStack_1260 * fVar79 + *pfVar26 * fVar165;
          fVar163 = fStack_125c * fVar79 + *pfVar28 * fVar165;
          fVar178 = pfVar2[1] * fVar79 + pfVar25[1] * fVar165;
          fVar184 = pfVar6[1] * fVar79 + pfVar27[1] * fVar165;
          fVar185 = pfVar9[1] * fVar79 + pfVar26[1] * fVar165;
          fVar186 = pfVar12[1] * fVar79 + pfVar28[1] * fVar165;
          fVar80 = fVar79 * pfVar2[2] + fVar165 * pfVar25[2];
          fVar100 = fVar79 * pfVar6[2] + fVar165 * pfVar27[2];
          fVar102 = fVar79 * fStack_f80 + fVar165 * pfVar26[2];
          fVar104 = fVar79 * fStack_f7c + fVar165 * pfVar28[2];
          fVar211 = fVar106 - fVar109;
          fVar213 = fVar121 - fVar124;
          fVar215 = fVar128 - fVar131;
          fVar217 = fVar135 - fVar138;
          fVar205 = fVar107 - fVar110;
          fVar206 = fVar122 - fVar125;
          fVar207 = fVar129 - fVar132;
          fVar208 = fVar136 - fVar139;
          fVar219 = fVar178 - fVar106;
          fVar220 = fVar184 - fVar121;
          fVar221 = fVar185 - fVar128;
          fVar222 = fVar186 - fVar135;
          fVar223 = fVar80 - fVar107;
          fVar226 = fVar100 - fVar122;
          fVar229 = fVar102 - fVar129;
          fVar232 = fVar104 - fVar136;
          local_10e8[0] = fVar205 * fVar219 - fVar211 * fVar223;
          local_10e8[1] = fVar206 * fVar220 - fVar213 * fVar226;
          local_10e8[2] = fVar207 * fVar221 - fVar215 * fVar229;
          local_10e8[3] = fVar208 * fVar222 - fVar217 * fVar232;
          fVar200 = fVar144 - fVar105;
          fVar202 = fVar155 - fVar120;
          fVar203 = fVar159 - fVar127;
          fVar204 = fVar163 - fVar134;
          fStack_12b0 = *(float *)(ray + k * 4);
          fStack_12c0 = *(float *)(ray + k * 4 + 0x10);
          fStack_1224 = *(float *)(ray + k * 4 + 0x40);
          fVar79 = *(float *)(ray + k * 4 + 0x50);
          fVar193 = fVar105 - fStack_12b0;
          fVar196 = fVar120 - fStack_12b0;
          fVar197 = fVar127 - fStack_12b0;
          fVar198 = fVar134 - fStack_12b0;
          fVar106 = fVar106 - fStack_12c0;
          fVar121 = fVar121 - fStack_12c0;
          fVar128 = fVar128 - fStack_12c0;
          fVar135 = fVar135 - fStack_12c0;
          fVar145 = fVar193 * fVar79 - fVar106 * fStack_1224;
          fVar156 = fVar196 * fVar79 - fVar121 * fStack_1224;
          fVar160 = fVar197 * fVar79 - fVar128 * fStack_1224;
          fVar164 = fVar198 * fVar79 - fVar135 * fStack_1224;
          fVar105 = fVar105 - fVar108;
          fVar120 = fVar120 - fVar123;
          fVar127 = fVar127 - fVar130;
          fVar134 = fVar134 - fVar137;
          local_10d8[0] = fVar105 * fVar223 - fVar205 * fVar200;
          local_10d8[1] = fVar120 * fVar226 - fVar206 * fVar202;
          local_10d8[2] = fVar127 * fVar229 - fVar207 * fVar203;
          local_10d8[3] = fVar134 * fVar232 - fVar208 * fVar204;
          fStack_1234 = *(float *)(ray + k * 4 + 0x20);
          fVar141 = *(float *)(ray + k * 4 + 0x60);
          auVar169._4_4_ = fVar141;
          auVar169._0_4_ = fVar141;
          auVar169._8_4_ = fVar141;
          auVar169._12_4_ = fVar141;
          fVar107 = fVar107 - fStack_1234;
          fVar122 = fVar122 - fStack_1234;
          fVar129 = fVar129 - fStack_1234;
          fVar136 = fVar136 - fStack_1234;
          fVar111 = fVar107 * fStack_1224 - fVar193 * fVar141;
          fVar126 = fVar122 * fStack_1224 - fVar196 * fVar141;
          fVar133 = fVar129 * fStack_1224 - fVar197 * fVar141;
          fVar140 = fVar136 * fStack_1224 - fVar198 * fVar141;
          fVar212 = fVar211 * fVar200 - fVar105 * fVar219;
          fVar214 = fVar213 * fVar202 - fVar120 * fVar220;
          fVar216 = fVar215 * fVar203 - fVar127 * fVar221;
          fVar218 = fVar217 * fVar204 - fVar134 * fVar222;
          fVar234 = fVar106 * fVar141 - fVar107 * fVar79;
          fVar235 = fVar121 * fVar141 - fVar122 * fVar79;
          fVar236 = fVar128 * fVar141 - fVar129 * fVar79;
          fVar237 = fVar135 * fVar141 - fVar136 * fVar79;
          fVar165 = local_10e8[0] * fStack_1224 + local_10d8[0] * fVar79 + fVar212 * fVar141;
          fVar101 = local_10e8[1] * fStack_1224 + local_10d8[1] * fVar79 + fVar214 * fVar141;
          fVar103 = local_10e8[2] * fStack_1224 + local_10d8[2] * fVar79 + fVar216 * fVar141;
          fVar141 = local_10e8[3] * fStack_1224 + local_10d8[3] * fVar79 + fVar218 * fVar141;
          uVar224 = (uint)fVar165 & 0x80000000;
          uVar227 = (uint)fVar101 & 0x80000000;
          uVar230 = (uint)fVar103 & 0x80000000;
          uVar233 = (uint)fVar141 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar200 * fVar234 + fVar219 * fVar111 + fVar223 * fVar145) ^ uVar224;
          tNear.field_0.i[1] =
               (uint)(fVar202 * fVar235 + fVar220 * fVar126 + fVar226 * fVar156) ^ uVar227;
          tNear.field_0.i[2] =
               (uint)(fVar203 * fVar236 + fVar221 * fVar133 + fVar229 * fVar160) ^ uVar230;
          tNear.field_0.i[3] =
               (uint)(fVar204 * fVar237 + fVar222 * fVar140 + fVar232 * fVar164) ^ uVar233;
          fVar145 = (float)((uint)(fVar234 * fVar105 + fVar111 * fVar211 + fVar145 * fVar205) ^
                           uVar224);
          fVar120 = (float)((uint)(fVar235 * fVar120 + fVar126 * fVar213 + fVar156 * fVar206) ^
                           uVar227);
          fVar126 = (float)((uint)(fVar236 * fVar127 + fVar133 * fVar215 + fVar160 * fVar207) ^
                           uVar230);
          fVar127 = (float)((uint)(fVar237 * fVar134 + fVar140 * fVar217 + fVar164 * fVar208) ^
                           uVar233);
          fVar105 = ABS(fVar165);
          fVar111 = ABS(fVar101);
          auVar209._0_8_ = CONCAT44(fVar101,fVar165) & 0x7fffffff7fffffff;
          auVar209._8_4_ = ABS(fVar103);
          auVar209._12_4_ = ABS(fVar141);
          bVar44 = ((0.0 <= fVar145 && 0.0 <= tNear.field_0.v[0]) && fVar165 != 0.0) &&
                   tNear.field_0.v[0] + fVar145 <= fVar105;
          auVar150._0_4_ = -(uint)bVar44;
          bVar45 = ((0.0 <= fVar120 && 0.0 <= tNear.field_0.v[1]) && fVar101 != 0.0) &&
                   tNear.field_0.v[1] + fVar120 <= fVar111;
          auVar150._4_4_ = -(uint)bVar45;
          bVar43 = ((0.0 <= fVar126 && 0.0 <= tNear.field_0.v[2]) && fVar103 != 0.0) &&
                   tNear.field_0.v[2] + fVar126 <= auVar209._8_4_;
          auVar150._8_4_ = -(uint)bVar43;
          bVar42 = ((0.0 <= fVar127 && 0.0 <= tNear.field_0.v[3]) && fVar141 != 0.0) &&
                   tNear.field_0.v[3] + fVar127 <= auVar209._12_4_;
          auVar150._12_4_ = -(uint)bVar42;
          lVar73 = uVar77 + lVar73;
          iVar49 = movmskps(uVar59,auVar150);
          local_12b8._4_4_ = fStack_12b0;
          local_12c8._4_4_ = fStack_12c0;
          if (iVar49 == 0) {
            uVar59 = 0;
          }
          else {
            fVar165 = (float)(uVar224 ^
                             (uint)(fVar193 * local_10e8[0] +
                                   fVar106 * local_10d8[0] + fVar107 * fVar212));
            fVar101 = (float)(uVar227 ^
                             (uint)(fVar196 * local_10e8[1] +
                                   fVar121 * local_10d8[1] + fVar122 * fVar214));
            fVar103 = (float)(uVar230 ^
                             (uint)(fVar197 * local_10e8[2] +
                                   fVar128 * local_10d8[2] + fVar129 * fVar216));
            fVar106 = (float)(uVar233 ^
                             (uint)(fVar198 * local_10e8[3] +
                                   fVar135 * local_10d8[3] + fVar136 * fVar218));
            fVar141 = *(float *)(ray + k * 4 + 0x30);
            local_12e8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_12e8._4_4_ = 0;
            local_12e8._8_4_ = 0;
            local_12e8._12_4_ = 0;
            bVar44 = (fVar141 * fVar105 < fVar165 && fVar165 <= (float)local_12e8._0_4_ * fVar105)
                     && bVar44;
            bVar45 = (fVar141 * fVar111 < fVar101 && fVar101 <= (float)local_12e8._0_4_ * fVar111)
                     && bVar45;
            valid.field_0._0_8_ = CONCAT44(-(uint)bVar45,-(uint)bVar44);
            bVar43 = (fVar141 * auVar209._8_4_ < fVar103 &&
                     fVar103 <= (float)local_12e8._0_4_ * auVar209._8_4_) && bVar43;
            valid.field_0.i[2] = -(uint)bVar43;
            bVar42 = (fVar141 * auVar209._12_4_ < fVar106 &&
                     fVar106 <= (float)local_12e8._0_4_ * auVar209._12_4_) && bVar42;
            valid.field_0.i[3] = -(uint)bVar42;
            uVar59 = movmskps(iVar49,(undefined1  [16])valid.field_0);
            if (uVar59 != 0) {
              local_10b8._8_8_ = uStack_1000;
              local_10b8._0_8_ = local_1008;
              auVar174 = rcpps(auVar169,auVar209);
              fVar79 = auVar174._0_4_;
              fVar141 = auVar174._4_4_;
              fVar121 = auVar174._8_4_;
              fVar122 = auVar174._12_4_;
              fVar128 = (float)DAT_01f7ba10;
              fVar129 = DAT_01f7ba10._4_4_;
              fVar133 = DAT_01f7ba10._12_4_;
              fVar107 = DAT_01f7ba10._8_4_;
              fVar79 = (fVar128 - fVar105 * fVar79) * fVar79 + fVar79;
              fVar141 = (fVar129 - fVar111 * fVar141) * fVar141 + fVar141;
              fVar121 = (fVar107 - auVar209._8_4_ * fVar121) * fVar121 + fVar121;
              fVar122 = (fVar133 - auVar209._12_4_ * fVar122) * fVar122 + fVar122;
              fVar165 = fVar165 * fVar79;
              fVar101 = fVar101 * fVar141;
              fVar103 = fVar103 * fVar121;
              fVar106 = fVar106 * fVar122;
              local_10f8._4_4_ = fVar101;
              local_10f8._0_4_ = fVar165;
              fStack_10f0 = fVar103;
              fStack_10ec = fVar106;
              auVar201._0_4_ = tNear.field_0.v[0] * fVar79;
              auVar201._4_4_ = tNear.field_0.v[1] * fVar141;
              auVar201._8_4_ = tNear.field_0.v[2] * fVar121;
              auVar201._12_4_ = tNear.field_0.v[3] * fVar122;
              auVar146 = minps(auVar201,_DAT_01f7ba10);
              auVar152._0_4_ = fVar79 * fVar145;
              auVar152._4_4_ = fVar141 * fVar120;
              auVar152._8_4_ = fVar121 * fVar126;
              auVar152._12_4_ = fVar122 * fVar127;
              auVar174 = minps(auVar152,_DAT_01f7ba10);
              auVar171._0_4_ = fVar128 - auVar146._0_4_;
              auVar171._4_4_ = fVar129 - auVar146._4_4_;
              auVar171._8_4_ = fVar107 - auVar146._8_4_;
              auVar171._12_4_ = fVar133 - auVar146._12_4_;
              auVar182._0_4_ = fVar128 - auVar174._0_4_;
              auVar182._4_4_ = fVar129 - auVar174._4_4_;
              auVar182._8_4_ = fVar107 - auVar174._8_4_;
              auVar182._12_4_ = fVar133 - auVar174._12_4_;
              local_1118 = blendvps(auVar146,auVar171,local_10b8);
              local_1108 = blendvps(auVar174,auVar182,local_10b8);
              local_10c8 = CONCAT44(fVar214,fVar212);
              uStack_10c0 = CONCAT44(fVar218,fVar216);
              auVar90._8_4_ = valid.field_0.i[2];
              auVar90._0_8_ = valid.field_0._0_8_;
              auVar90._12_4_ = valid.field_0.i[3];
              auVar46._4_4_ = fVar101;
              auVar46._0_4_ = fVar165;
              auVar46._8_4_ = fVar103;
              auVar46._12_4_ = fVar106;
              auVar146 = blendvps(_DAT_01f7a9f0,auVar46,auVar90);
              auVar172._4_4_ = auVar146._0_4_;
              auVar172._0_4_ = auVar146._4_4_;
              auVar172._8_4_ = auVar146._12_4_;
              auVar172._12_4_ = auVar146._8_4_;
              auVar174 = minps(auVar172,auVar146);
              auVar91._0_8_ = auVar174._8_8_;
              auVar91._8_4_ = auVar174._0_4_;
              auVar91._12_4_ = auVar174._4_4_;
              auVar174 = minps(auVar91,auVar174);
              auVar92._0_8_ =
                   CONCAT44(-(uint)(auVar174._4_4_ == auVar146._4_4_ && bVar45),
                            -(uint)(auVar174._0_4_ == auVar146._0_4_ && bVar44));
              auVar92._8_4_ = -(uint)(auVar174._8_4_ == auVar146._8_4_ && bVar43);
              auVar92._12_4_ = -(uint)(auVar174._12_4_ == auVar146._12_4_ && bVar42);
              iVar49 = movmskps(uVar59,auVar92);
              aVar112 = valid.field_0;
              if (iVar49 != 0) {
                aVar112.i[2] = auVar92._8_4_;
                aVar112._0_8_ = auVar92._0_8_;
                aVar112.i[3] = auVar92._12_4_;
              }
              uVar59 = movmskps(iVar49,(undefined1  [16])aVar112);
              local_12b8 = 0;
              fStack_12bc = fStack_12c0;
              fStack_12ac = fStack_12b0;
              if (uVar59 != 0) {
                for (; (uVar59 >> local_12b8 & 1) == 0; local_12b8 = local_12b8 + 1) {
                }
              }
LAB_0027f84a:
              uVar59 = *(uint *)(lVar73 + 0x40 + local_12b8 * 4);
              uVar55 = (ulong)uVar59;
              local_12c8 = (pSVar33->geometries).items[uVar55].ptr;
              if ((local_12c8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[local_12b8] = 0.0;
LAB_0027fb60:
                uVar59 = movmskps((int)uVar55,(undefined1  [16])valid.field_0);
                if (uVar59 == 0) goto LAB_0028027a;
                auVar47._4_4_ = fVar101;
                auVar47._0_4_ = fVar165;
                auVar47._8_4_ = fVar103;
                auVar47._12_4_ = fVar106;
                auVar146 = blendvps(_DAT_01f7a9f0,auVar47,(undefined1  [16])valid.field_0);
                auVar173._4_4_ = auVar146._0_4_;
                auVar173._0_4_ = auVar146._4_4_;
                auVar173._8_4_ = auVar146._12_4_;
                auVar173._12_4_ = auVar146._8_4_;
                auVar174 = minps(auVar173,auVar146);
                auVar114._0_8_ = auVar174._8_8_;
                auVar114._8_4_ = auVar174._0_4_;
                auVar114._12_4_ = auVar174._4_4_;
                auVar174 = minps(auVar114,auVar174);
                auVar115._0_8_ =
                     CONCAT44(-(uint)(auVar174._4_4_ == auVar146._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar174._0_4_ == auVar146._0_4_) & valid.field_0._0_4_);
                auVar115._8_4_ = -(uint)(auVar174._8_4_ == auVar146._8_4_) & valid.field_0._8_4_;
                auVar115._12_4_ = -(uint)(auVar174._12_4_ == auVar146._12_4_) & valid.field_0._12_4_
                ;
                iVar49 = movmskps(uVar59,auVar115);
                aVar94 = valid.field_0;
                if (iVar49 != 0) {
                  aVar94.i[2] = auVar115._8_4_;
                  aVar94._0_8_ = auVar115._0_8_;
                  aVar94.i[3] = auVar115._12_4_;
                }
                uVar50 = movmskps(iVar49,(undefined1  [16])aVar94);
                uVar55 = CONCAT44((int)(uVar55 >> 0x20),uVar50);
                local_12b8 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> local_12b8 & 1) == 0; local_12b8 = local_12b8 + 1) {
                  }
                }
                goto LAB_0027f84a;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (local_12c8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1078 = *(undefined4 *)(local_1118 + local_12b8 * 4);
                local_1068 = *(undefined4 *)(local_1108 + local_12b8 * 4);
                local_10a8._4_4_ = local_10e8[local_12b8];
                local_1098._4_4_ = local_10d8[local_12b8];
                local_1048._4_4_ = uVar59;
                local_1048._0_4_ = uVar59;
                local_1048._8_4_ = uVar59;
                local_1048._12_4_ = uVar59;
                local_1058._4_4_ = *(undefined4 *)(lVar73 + 0x50 + local_12b8 * 4);
                local_1088._4_4_ = *(undefined4 *)((long)&local_10c8 + local_12b8 * 4);
                local_10a8._0_4_ = local_10a8._4_4_;
                fStack_10a0 = (float)local_10a8._4_4_;
                fStack_109c = (float)local_10a8._4_4_;
                local_1098._0_4_ = local_1098._4_4_;
                fStack_1090 = (float)local_1098._4_4_;
                fStack_108c = (float)local_1098._4_4_;
                local_1088._0_4_ = local_1088._4_4_;
                local_1088._8_4_ = local_1088._4_4_;
                local_1088._12_4_ = local_1088._4_4_;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1058._0_4_ = local_1058._4_4_;
                local_1058._8_4_ = local_1058._4_4_;
                local_1058._12_4_ = local_1058._4_4_;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                *(float *)(ray + k * 4 + 0x80) = local_10e8[local_12b8 - 4];
                local_12d8 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(int)uVar58 * 0x10);
                args.valid = (int *)local_12d8;
                args.geometryUserPtr = local_12c8->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (local_12c8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_12c8->intersectionFilterN)(&args);
                }
                if (local_12d8 == (undefined1  [16])0x0) {
                  auVar113._8_4_ = 0xffffffff;
                  auVar113._0_8_ = 0xffffffffffffffff;
                  auVar113._12_4_ = 0xffffffff;
                  auVar113 = auVar113 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var41 = context->args->filter;
                  if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_12c8->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var41)(&args);
                  }
                  auVar93._0_4_ = -(uint)(local_12d8._0_4_ == 0);
                  auVar93._4_4_ = -(uint)(local_12d8._4_4_ == 0);
                  auVar93._8_4_ = -(uint)(local_12d8._8_4_ == 0);
                  auVar93._12_4_ = -(uint)(local_12d8._12_4_ == 0);
                  auVar113 = auVar93 ^ _DAT_01f7ae20;
                  if (local_12d8 != (undefined1  [16])0x0) {
                    auVar174 = blendvps(*(undefined1 (*) [16])args.hit,
                                        *(undefined1 (*) [16])(args.ray + 0xc0),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                        *(undefined1 (*) [16])(args.ray + 0xd0),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                        *(undefined1 (*) [16])(args.ray + 0xe0),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                        *(undefined1 (*) [16])(args.ray + 0xf0),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                        *(undefined1 (*) [16])(args.ray + 0x100),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                        *(undefined1 (*) [16])(args.ray + 0x110),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                        *(undefined1 (*) [16])(args.ray + 0x120),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                        *(undefined1 (*) [16])(args.ray + 0x130),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                        *(undefined1 (*) [16])(args.ray + 0x140),auVar93);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar174;
                  }
                }
                if ((_DAT_01f7bb20 & auVar113) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_12e8._0_4_;
                }
                else {
                  local_12e8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[local_12b8] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(fVar165 <= (float)local_12e8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fVar101 <= (float)local_12e8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fVar103 <= (float)local_12e8._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fVar106 <= (float)local_12e8._0_4_) & valid.field_0.i[3];
                uVar55 = local_12b8;
                goto LAB_0027fb60;
              }
              uVar50 = *(undefined4 *)(local_1118 + local_12b8 * 4);
              uVar51 = *(undefined4 *)(local_1108 + local_12b8 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_10e8[local_12b8 - 4];
              *(float *)(ray + k * 4 + 0xc0) = local_10e8[local_12b8];
              *(float *)(ray + k * 4 + 0xd0) = local_10d8[local_12b8];
              *(undefined4 *)(ray + k * 4 + 0xe0) =
                   *(undefined4 *)((long)&local_10c8 + local_12b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar50;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar51;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar73 + 0x50 + local_12b8 * 4)
              ;
              *(uint *)(ray + k * 4 + 0x120) = uVar59;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar59 = context->user->instPrimID[0];
              *(uint *)(ray + k * 4 + 0x140) = uVar59;
LAB_0028027a:
              local_12b8._4_4_ = *(float *)(ray + k * 4);
              local_12c8._4_4_ = *(float *)(ray + k * 4 + 0x10);
              fStack_1234 = *(float *)(ray + k * 4 + 0x20);
              fStack_1224 = *(float *)(ray + k * 4 + 0x40);
              fVar79 = *(float *)(ray + k * 4 + 0x50);
              uVar50 = *(undefined4 *)(ray + k * 4 + 0x60);
              auVar169._4_4_ = uVar50;
              auVar169._0_4_ = uVar50;
              auVar169._8_4_ = uVar50;
              auVar169._12_4_ = uVar50;
              pSVar60 = pSVar33;
            }
          }
          fVar144 = fVar142 - fVar144;
          fVar155 = fVar153 - fVar155;
          fVar159 = fVar157 - fVar159;
          fVar163 = fVar161 - fVar163;
          fVar178 = fVar143 - fVar178;
          fVar184 = fVar154 - fVar184;
          fStack_1260 = fVar158 - fVar185;
          fStack_125c = fVar162 - fVar186;
          fVar80 = (float)local_1348._0_4_ - fVar80;
          fVar100 = (float)local_1348._4_4_ - fVar100;
          fVar102 = fStack_1340 - fVar102;
          fVar104 = fStack_133c - fVar104;
          fVar108 = fVar108 - fVar142;
          fVar123 = fVar123 - fVar153;
          fVar130 = fVar130 - fVar157;
          fVar137 = fVar137 - fVar161;
          fVar109 = fVar109 - fVar143;
          fVar124 = fVar124 - fVar154;
          fVar131 = fVar131 - fVar158;
          fVar138 = fVar138 - fVar162;
          fVar110 = fVar110 - (float)local_1348._0_4_;
          fVar125 = fVar125 - (float)local_1348._4_4_;
          fVar132 = fVar132 - fStack_1340;
          fVar139 = fVar139 - fStack_133c;
          local_10e8[0] = fVar109 * fVar80 - fVar110 * fVar178;
          local_10e8[1] = fVar124 * fVar100 - fVar125 * fVar184;
          local_10e8[2] = fVar131 * fVar102 - fVar132 * fStack_1260;
          local_10e8[3] = fVar138 * fVar104 - fVar139 * fStack_125c;
          local_10d8[0] = fVar110 * fVar144 - fVar108 * fVar80;
          local_10d8[1] = fVar125 * fVar155 - fVar123 * fVar100;
          local_10d8[2] = fVar132 * fVar159 - fVar130 * fVar102;
          local_10d8[3] = fVar139 * fVar163 - fVar137 * fVar104;
          fVar134 = fVar108 * fVar178 - fVar109 * fVar144;
          fVar135 = fVar123 * fVar184 - fVar124 * fVar155;
          fStack_12f0 = fVar130 * fStack_1260 - fVar131 * fVar159;
          fStack_12ec = fVar137 * fStack_125c - fVar138 * fVar163;
          fVar142 = fVar142 - local_12b8._4_4_;
          fVar153 = fVar153 - local_12b8._4_4_;
          fStack_1310 = fVar157 - local_12b8._4_4_;
          fStack_130c = fVar161 - local_12b8._4_4_;
          fVar143 = fVar143 - local_12c8._4_4_;
          fVar154 = fVar154 - local_12c8._4_4_;
          fVar158 = fVar158 - local_12c8._4_4_;
          fVar162 = fVar162 - local_12c8._4_4_;
          local_1348._0_4_ = (float)local_1348._0_4_ - fStack_1234;
          local_1348._4_4_ = (float)local_1348._4_4_ - fStack_1234;
          fStack_1340 = fStack_1340 - fStack_1234;
          fStack_133c = fStack_133c - fStack_1234;
          fVar105 = auVar169._0_4_;
          fVar106 = auVar169._4_4_;
          fVar107 = auVar169._8_4_;
          fVar111 = auVar169._12_4_;
          fVar127 = fVar143 * fVar105 - (float)local_1348._0_4_ * fVar79;
          fVar128 = fVar154 * fVar106 - (float)local_1348._4_4_ * fVar79;
          fVar129 = fVar158 * fVar107 - fStack_1340 * fVar79;
          fVar133 = fVar162 * fVar111 - fStack_133c * fVar79;
          fVar141 = (float)local_1348._0_4_ * fStack_1224 - fVar142 * fVar105;
          fVar165 = (float)local_1348._4_4_ * fStack_1224 - fVar153 * fVar106;
          fVar101 = fStack_1340 * fStack_1224 - fStack_1310 * fVar107;
          fVar103 = fStack_133c * fStack_1224 - fStack_130c * fVar111;
          fVar120 = fVar142 * fVar79 - fVar143 * fStack_1224;
          fVar121 = fVar153 * fVar79 - fVar154 * fStack_1224;
          fVar122 = fStack_1310 * fVar79 - fVar158 * fStack_1224;
          fVar126 = fStack_130c * fVar79 - fVar162 * fStack_1224;
          local_12f8 = CONCAT44(fVar135,fVar134);
          fVar105 = fStack_1224 * local_10e8[0] + fVar79 * local_10d8[0] + fVar105 * fVar134;
          fVar106 = fStack_1224 * local_10e8[1] + fVar79 * local_10d8[1] + fVar106 * fVar135;
          fVar107 = fStack_1224 * local_10e8[2] + fVar79 * local_10d8[2] + fVar107 * fStack_12f0;
          fVar111 = fStack_1224 * local_10e8[3] + fVar79 * local_10d8[3] + fVar111 * fStack_12ec;
          uVar224 = (uint)fVar105 & 0x80000000;
          uVar227 = (uint)fVar106 & 0x80000000;
          uVar230 = (uint)fVar107 & 0x80000000;
          uVar233 = (uint)fVar111 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar108 * fVar127 + fVar109 * fVar141 + fVar110 * fVar120) ^ uVar224;
          tNear.field_0.i[1] =
               (uint)(fVar123 * fVar128 + fVar124 * fVar165 + fVar125 * fVar121) ^ uVar227;
          tNear.field_0.i[2] =
               (uint)(fVar130 * fVar129 + fVar131 * fVar101 + fVar132 * fVar122) ^ uVar230;
          tNear.field_0.i[3] =
               (uint)(fVar137 * fVar133 + fVar138 * fVar103 + fVar139 * fVar126) ^ uVar233;
          fVar80 = (float)((uint)(fVar127 * fVar144 + fVar141 * fVar178 + fVar120 * fVar80) ^
                          uVar224);
          fVar165 = (float)((uint)(fVar128 * fVar155 + fVar165 * fVar184 + fVar121 * fVar100) ^
                           uVar227);
          fVar144 = (float)((uint)(fVar129 * fVar159 + fVar101 * fStack_1260 + fVar122 * fVar102) ^
                           uVar230);
          fVar178 = (float)((uint)(fVar133 * fVar163 + fVar103 * fStack_125c + fVar126 * fVar104) ^
                           uVar233);
          fVar79 = ABS(fVar105);
          fVar141 = ABS(fVar106);
          auVar151._0_8_ = CONCAT44(fVar106,fVar105) & 0x7fffffff7fffffff;
          auVar151._8_4_ = ABS(fVar107);
          auVar151._12_4_ = ABS(fVar111);
          bVar44 = tNear.field_0.v[0] + fVar80 <= fVar79 &&
                   ((0.0 <= fVar80 && 0.0 <= tNear.field_0.v[0]) && fVar105 != 0.0);
          auVar170._0_4_ = -(uint)bVar44;
          bVar45 = tNear.field_0.v[1] + fVar165 <= fVar141 &&
                   ((0.0 <= fVar165 && 0.0 <= tNear.field_0.v[1]) && fVar106 != 0.0);
          auVar170._4_4_ = -(uint)bVar45;
          bVar43 = tNear.field_0.v[2] + fVar144 <= auVar151._8_4_ &&
                   ((0.0 <= fVar144 && 0.0 <= tNear.field_0.v[2]) && fVar107 != 0.0);
          auVar170._8_4_ = -(uint)bVar43;
          bVar42 = tNear.field_0.v[3] + fVar178 <= auVar151._12_4_ &&
                   ((0.0 <= fVar178 && 0.0 <= tNear.field_0.v[3]) && fVar111 != 0.0);
          auVar170._12_4_ = -(uint)bVar42;
          iVar49 = movmskps(uVar59,auVar170);
          if (iVar49 != 0) {
            fVar102 = (float)(uVar224 ^
                             (uint)(fVar142 * local_10e8[0] +
                                   fVar143 * local_10d8[0] + (float)local_1348._0_4_ * fVar134));
            fVar103 = (float)(uVar227 ^
                             (uint)(fVar153 * local_10e8[1] +
                                   fVar154 * local_10d8[1] + (float)local_1348._4_4_ * fVar135));
            fVar159 = (float)(uVar230 ^
                             (uint)(fStack_1310 * local_10e8[2] +
                                   fVar158 * local_10d8[2] + fStack_1340 * fStack_12f0));
            fVar104 = (float)(uVar233 ^
                             (uint)(fStack_130c * local_10e8[3] +
                                   fVar162 * local_10d8[3] + fStack_133c * fStack_12ec));
            fVar100 = *(float *)(ray + k * 4 + 0x30);
            fVar101 = *(float *)(ray + k * 4 + 0x80);
            uVar50 = 0;
            fVar155 = 0.0;
            fVar184 = 0.0;
            bVar44 = (fVar102 <= fVar101 * fVar79 && fVar100 * fVar79 < fVar102) && bVar44;
            bVar45 = (fVar103 <= fVar101 * fVar141 && fVar100 * fVar141 < fVar103) && bVar45;
            valid.field_0._0_8_ = CONCAT44(-(uint)bVar45,-(uint)bVar44);
            bVar43 = (fVar159 <= fVar101 * auVar151._8_4_ && fVar100 * auVar151._8_4_ < fVar159) &&
                     bVar43;
            valid.field_0.i[2] = -(uint)bVar43;
            bVar42 = (fVar104 <= fVar101 * auVar151._12_4_ && fVar100 * auVar151._12_4_ < fVar104)
                     && bVar42;
            valid.field_0.i[3] = -(uint)bVar42;
            iVar49 = movmskps(iVar49,(undefined1  [16])valid.field_0);
            if (iVar49 != 0) {
              local_10b8._8_8_ = uStack_1010;
              local_10b8._0_8_ = local_1018;
              pSVar60 = context->scene;
              auVar174 = rcpps(auVar170,auVar151);
              fVar100 = auVar174._0_4_;
              fVar163 = auVar174._4_4_;
              fVar105 = auVar174._8_4_;
              fVar106 = auVar174._12_4_;
              fVar108 = (float)DAT_01f7ba10;
              fVar109 = DAT_01f7ba10._4_4_;
              fVar110 = DAT_01f7ba10._12_4_;
              fVar107 = DAT_01f7ba10._8_4_;
              fVar100 = (fVar108 - fVar79 * fVar100) * fVar100 + fVar100;
              fVar163 = (fVar109 - fVar141 * fVar163) * fVar163 + fVar163;
              fVar105 = (fVar107 - auVar151._8_4_ * fVar105) * fVar105 + fVar105;
              fVar106 = (fVar110 - auVar151._12_4_ * fVar106) * fVar106 + fVar106;
              auVar199._0_4_ = fVar102 * fVar100;
              auVar199._4_4_ = fVar103 * fVar163;
              auVar199._8_4_ = fVar159 * fVar105;
              auVar199._12_4_ = fVar104 * fVar106;
              _local_10f8 = auVar199;
              auVar210._0_4_ = tNear.field_0.v[0] * fVar100;
              auVar210._4_4_ = tNear.field_0.v[1] * fVar163;
              auVar210._8_4_ = tNear.field_0.v[2] * fVar105;
              auVar210._12_4_ = tNear.field_0.v[3] * fVar106;
              auVar146 = minps(auVar210,_DAT_01f7ba10);
              auVar192._0_4_ = fVar100 * fVar80;
              auVar192._4_4_ = fVar163 * fVar165;
              auVar192._8_4_ = fVar105 * fVar144;
              auVar192._12_4_ = fVar106 * fVar178;
              auVar174 = minps(auVar192,_DAT_01f7ba10);
              auVar175._0_4_ = fVar108 - auVar146._0_4_;
              auVar175._4_4_ = fVar109 - auVar146._4_4_;
              auVar175._8_4_ = fVar107 - auVar146._8_4_;
              auVar175._12_4_ = fVar110 - auVar146._12_4_;
              auVar183._0_4_ = fVar108 - auVar174._0_4_;
              auVar183._4_4_ = fVar109 - auVar174._4_4_;
              auVar183._8_4_ = fVar107 - auVar174._8_4_;
              auVar183._12_4_ = fVar110 - auVar174._12_4_;
              local_1118 = blendvps(auVar146,auVar175,local_10b8);
              local_1108 = blendvps(auVar174,auVar183,local_10b8);
              local_10c8 = local_12f8;
              uStack_10c0 = CONCAT44(fStack_12ec,fStack_12f0);
              auVar95._8_4_ = valid.field_0.i[2];
              auVar95._0_8_ = valid.field_0._0_8_;
              auVar95._12_4_ = valid.field_0.i[3];
              auVar146 = blendvps(_DAT_01f7a9f0,auVar199,auVar95);
              auVar176._4_4_ = auVar146._0_4_;
              auVar176._0_4_ = auVar146._4_4_;
              auVar176._8_4_ = auVar146._12_4_;
              auVar176._12_4_ = auVar146._8_4_;
              auVar174 = minps(auVar176,auVar146);
              auVar96._0_8_ = auVar174._8_8_;
              auVar96._8_4_ = auVar174._0_4_;
              auVar96._12_4_ = auVar174._4_4_;
              auVar174 = minps(auVar96,auVar174);
              auVar97._0_8_ =
                   CONCAT44(-(uint)(auVar174._4_4_ == auVar146._4_4_ && bVar45),
                            -(uint)(auVar174._0_4_ == auVar146._0_4_ && bVar44));
              auVar97._8_4_ = -(uint)(auVar174._8_4_ == auVar146._8_4_ && bVar43);
              auVar97._12_4_ = -(uint)(auVar174._12_4_ == auVar146._12_4_ && bVar42);
              iVar49 = movmskps((int)context,auVar97);
              aVar116 = valid.field_0;
              if (iVar49 != 0) {
                aVar116.i[2] = auVar97._8_4_;
                aVar116._0_8_ = auVar97._0_8_;
                aVar116.i[3] = auVar97._12_4_;
              }
              uVar51 = movmskps(iVar49,(undefined1  [16])aVar116);
              uVar56 = CONCAT44((int)((ulong)context >> 0x20),uVar51);
              uVar55 = 0;
              fStack_12c0 = local_12c8._4_4_;
              fStack_12bc = local_12c8._4_4_;
              fStack_12b0 = local_12b8._4_4_;
              fStack_12ac = local_12b8._4_4_;
              local_12b8._0_4_ = local_12b8._4_4_;
              local_12c8._0_4_ = local_12c8._4_4_;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                }
              }
LAB_0027fde0:
              uVar59 = *(uint *)(lVar73 + 0x40 + uVar55 * 4);
              uVar56 = (ulong)uVar59;
              pGVar35 = (pSVar60->geometries).items[uVar56].ptr;
              if ((pGVar35->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[uVar55] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar35->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar50 = *(undefined4 *)(local_1118 + uVar55 * 4);
                  uVar51 = *(undefined4 *)(local_1108 + uVar55 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_10e8[uVar55 - 4];
                  *(float *)(ray + k * 4 + 0xc0) = local_10e8[uVar55];
                  *(float *)(ray + k * 4 + 0xd0) = local_10d8[uVar55];
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&local_10c8 + uVar55 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar50;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar51;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar73 + 0x50 + uVar55 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar59;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0027f69c;
                }
                local_1348._4_4_ = uVar50;
                local_1348._0_4_ = fVar101;
                fStack_1340 = fVar155;
                fStack_133c = fVar184;
                local_1078 = *(undefined4 *)(local_1118 + uVar55 * 4);
                local_1068 = *(undefined4 *)(local_1108 + uVar55 * 4);
                fVar79 = local_10e8[uVar55];
                fVar141 = local_10d8[uVar55];
                local_1048._4_4_ = uVar59;
                local_1048._0_4_ = uVar59;
                local_1048._8_4_ = uVar59;
                local_1048._12_4_ = uVar59;
                uVar50 = *(undefined4 *)(lVar73 + 0x50 + uVar55 * 4);
                local_1058._4_4_ = uVar50;
                local_1058._0_4_ = uVar50;
                local_1058._8_4_ = uVar50;
                local_1058._12_4_ = uVar50;
                local_10a8._4_4_ = fVar79;
                local_10a8._0_4_ = fVar79;
                fStack_10a0 = fVar79;
                fStack_109c = fVar79;
                local_1098._4_4_ = fVar141;
                local_1098._0_4_ = fVar141;
                fStack_1090 = fVar141;
                fStack_108c = fVar141;
                uVar50 = *(undefined4 *)((long)&local_10c8 + uVar55 * 4);
                local_1088._4_4_ = uVar50;
                local_1088._0_4_ = uVar50;
                local_1088._8_4_ = uVar50;
                local_1088._12_4_ = uVar50;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uStack_1064 = local_1068;
                uStack_1060 = local_1068;
                uStack_105c = local_1068;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                *(float *)(ray + k * 4 + 0x80) = local_10e8[uVar55 - 4];
                local_12d8 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(int)uVar58 * 0x10);
                args.valid = (int *)local_12d8;
                args.geometryUserPtr = pGVar35->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar35->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar35->intersectionFilterN)(&args);
                }
                if (local_12d8 == (undefined1  [16])0x0) {
                  auVar117._8_4_ = 0xffffffff;
                  auVar117._0_8_ = 0xffffffffffffffff;
                  auVar117._12_4_ = 0xffffffff;
                  auVar117 = auVar117 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var41 = context->args->filter;
                  if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar35->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var41)(&args);
                  }
                  auVar98._0_4_ = -(uint)(local_12d8._0_4_ == 0);
                  auVar98._4_4_ = -(uint)(local_12d8._4_4_ == 0);
                  auVar98._8_4_ = -(uint)(local_12d8._8_4_ == 0);
                  auVar98._12_4_ = -(uint)(local_12d8._12_4_ == 0);
                  auVar117 = auVar98 ^ _DAT_01f7ae20;
                  if (local_12d8 != (undefined1  [16])0x0) {
                    auVar174 = blendvps(*(undefined1 (*) [16])args.hit,
                                        *(undefined1 (*) [16])(args.ray + 0xc0),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                        *(undefined1 (*) [16])(args.ray + 0xd0),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                        *(undefined1 (*) [16])(args.ray + 0xe0),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                        *(undefined1 (*) [16])(args.ray + 0xf0),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                        *(undefined1 (*) [16])(args.ray + 0x100),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                        *(undefined1 (*) [16])(args.ray + 0x110),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                        *(undefined1 (*) [16])(args.ray + 0x120),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                        *(undefined1 (*) [16])(args.ray + 0x130),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar174;
                    auVar174 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                        *(undefined1 (*) [16])(args.ray + 0x140),auVar98);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar174;
                  }
                }
                if ((_DAT_01f7bb20 & auVar117) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar101;
                }
                else {
                  _local_1348 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[uVar55] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(auVar199._0_4_ <= (float)local_1348._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(auVar199._4_4_ <= (float)local_1348._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(auVar199._8_4_ <= (float)local_1348._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(auVar199._12_4_ <= (float)local_1348._0_4_) & valid.field_0.i[3];
                uVar56 = uVar55;
                fVar101 = (float)local_1348._0_4_;
                uVar50 = local_1348._4_4_;
                fVar155 = fStack_1340;
                fVar184 = fStack_133c;
              }
              iVar49 = movmskps((int)uVar56,(undefined1  [16])valid.field_0);
              if (iVar49 == 0) goto LAB_0027f69c;
              auVar146 = blendvps(_DAT_01f7a9f0,auVar199,(undefined1  [16])valid.field_0);
              auVar177._4_4_ = auVar146._0_4_;
              auVar177._0_4_ = auVar146._4_4_;
              auVar177._8_4_ = auVar146._12_4_;
              auVar177._12_4_ = auVar146._8_4_;
              auVar174 = minps(auVar177,auVar146);
              auVar118._0_8_ = auVar174._8_8_;
              auVar118._8_4_ = auVar174._0_4_;
              auVar118._12_4_ = auVar174._4_4_;
              auVar174 = minps(auVar118,auVar174);
              auVar119._0_8_ =
                   CONCAT44(-(uint)(auVar174._4_4_ == auVar146._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar174._0_4_ == auVar146._0_4_) & valid.field_0._0_4_);
              auVar119._8_4_ = -(uint)(auVar174._8_4_ == auVar146._8_4_) & valid.field_0._8_4_;
              auVar119._12_4_ = -(uint)(auVar174._12_4_ == auVar146._12_4_) & valid.field_0._12_4_;
              iVar49 = movmskps(iVar49,auVar119);
              aVar99 = valid.field_0;
              if (iVar49 != 0) {
                aVar99.i[2] = auVar119._8_4_;
                aVar99._0_8_ = auVar119._0_8_;
                aVar99.i[3] = auVar119._12_4_;
              }
              uVar51 = movmskps(iVar49,(undefined1  [16])aVar99);
              uVar56 = CONCAT44((int)(uVar56 >> 0x20),uVar51);
              uVar55 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                }
              }
              goto LAB_0027fde0;
            }
          }
LAB_0027f69c:
          lVar54 = lVar54 + 1;
        } while (lVar54 != uVar57 - 8);
      }
      uVar50 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar174._4_4_ = uVar50;
      auVar174._0_4_ = uVar50;
      auVar174._8_4_ = uVar50;
      auVar174._12_4_ = uVar50;
      fVar100 = local_fa8;
      fVar101 = fStack_fa4;
      fVar155 = fStack_fa0;
      fVar141 = fStack_f9c;
      fVar184 = local_fc8;
      fVar102 = fStack_fc4;
      fVar103 = fStack_fc0;
      fVar80 = fStack_fbc;
      fVar159 = local_fd8;
      fVar104 = fStack_fd4;
      fVar163 = fStack_fd0;
      fVar144 = fStack_fcc;
      fVar105 = local_fe8;
      fVar106 = fStack_fe4;
      fVar107 = fStack_fe0;
      fVar178 = fStack_fdc;
      iVar225 = local_ff8;
      iVar228 = iStack_ff4;
      iVar231 = iStack_ff0;
      iVar49 = iStack_fec;
      fVar108 = local_f98;
      fVar109 = fStack_f94;
      fVar110 = fStack_f90;
      fVar79 = fStack_f8c;
      fVar111 = local_fb8;
      fVar120 = fStack_fb4;
      fVar121 = fStack_fb0;
      fVar165 = fStack_fac;
    }
    if (pSVar52 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }